

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O2

int __thiscall libDAI::MaxPlus::init(MaxPlus *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long in_RAX;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar3;
  long lVar4;
  
  for (lVar4 = *(long *)ctx; lVar4 != *(long *)(ctx + 8); lVar4 = lVar4 + 0x10) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x40))
                      ((long *)CONCAT44(extraout_var,iVar1),lVar4);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    plVar3 = *(long **)(*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x70) + lVar2 * 0x18);
    while( true ) {
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      in_RAX = *(long *)(CONCAT44(extraout_var_01,iVar1) + 0x70);
      if (plVar3 == *(long **)(in_RAX + 8 + lVar2 * 0x18)) break;
      TProb<double>::fill((this->_messages).
                          super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          *(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar2].
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data + *plVar3 * 8),1.0);
      plVar3 = plVar3 + 1;
    }
  }
  return (int)in_RAX;
}

Assistant:

void MaxPlus::init( const VarSet &ns ) {
        for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ ) {
            size_t ni = grm().findVar( *n );
            for( FactorGraph::nb_cit I = grm().nbV(ni).begin(); I != grm().nbV(ni).end(); I++ )
                message(ni,*I).fill( 1.0 );
        }
    }